

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

int DumpHash(FConsoleCommand **table,bool aliases,char *pattern)

{
  FConsoleAlias *this;
  bool bVar1;
  int iVar2;
  undefined7 in_register_00000031;
  long lVar3;
  int iVar4;
  FConsoleCommand **ppFVar5;
  
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 0xfb; lVar3 = lVar3 + 1) {
    ppFVar5 = Commands + lVar3;
    while (this = (FConsoleAlias *)*ppFVar5, this != (FConsoleAlias *)0x0) {
      bVar1 = CheckWildcards((char *)CONCAT71(in_register_00000031,aliases),
                             (this->super_FConsoleCommand).m_Name);
      if (bVar1) {
        iVar2 = (*(this->super_FConsoleCommand)._vptr_FConsoleCommand[2])(this);
        if ((char)iVar2 == '\0') {
          if ((char)table == '\0') {
            iVar4 = iVar4 + 1;
            FConsoleCommand::PrintCommand((FConsoleCommand *)this);
          }
        }
        else if ((char)table != '\0') {
          iVar4 = iVar4 + 1;
          FConsoleAlias::PrintAlias(this);
        }
      }
      ppFVar5 = &(this->super_FConsoleCommand).m_Next;
    }
  }
  return iVar4;
}

Assistant:

static int DumpHash (FConsoleCommand **table, bool aliases, const char *pattern=NULL)
{
	int bucket, count;
	FConsoleCommand *cmd;

	for (bucket = count = 0; bucket < FConsoleCommand::HASH_SIZE; bucket++)
	{
		cmd = table[bucket];
		while (cmd)
		{
			if (CheckWildcards (pattern, cmd->m_Name))
			{
				if (cmd->IsAlias())
				{
					if (aliases)
					{
						++count;
						static_cast<FConsoleAlias *>(cmd)->PrintAlias ();
					}
				}
				else if (!aliases)
				{
					++count;
					cmd->PrintCommand ();
				}
			}
			cmd = cmd->m_Next;
		}
	}
	return count;
}